

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void rotate_matrix(float angle,float x,float y,float z,float *r)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dd;
  float fVar10;
  undefined1 in_register_00001284 [12];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined8 local_40;
  float local_38;
  float local_30;
  float local_2c;
  float local_28;
  undefined4 uStack_24;
  undefined4 uStack_1c;
  undefined1 local_18 [16];
  undefined4 uVar9;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  
  local_18._4_12_ = in_register_00001284;
  local_18._0_4_ = y;
  fVar6 = (angle * 3.1415927) / 180.0;
  local_28 = x;
  uStack_24 = in_XMM1_Db;
  uStack_1c = in_XMM1_Dd;
  local_2c = (float)SDL_cosf();
  local_30 = (float)SDL_sinf(fVar6);
  fVar6 = (float)SDL_cosf(fVar6);
  dVar8 = (double)SDL_sqrt(SUB84((double)(local_28 * local_28 +
                                         (float)local_18._0_4_ * (float)local_18._0_4_),0));
  uVar9 = (undefined4)((ulong)dVar8 >> 0x20);
  fVar7 = (float)dVar8;
  auVar12._4_4_ = uStack_24;
  auVar12._0_4_ = local_28;
  auVar12._8_4_ = uStack_24;
  auVar12._12_4_ = uStack_1c;
  auVar11._8_8_ = auVar12._8_8_;
  auVar11._4_4_ = local_18._0_4_;
  auVar11._0_4_ = local_28;
  auVar13._0_12_ = auVar11._0_12_;
  auVar13._12_4_ = local_18._4_4_;
  auVar14._4_4_ = fVar7;
  auVar14._0_4_ = fVar7;
  auVar14._8_4_ = uVar9;
  auVar14._12_4_ = uVar9;
  auVar14 = divps(auVar13,auVar14);
  local_40 = auVar14._0_8_;
  local_38 = 0.0 / fVar7;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    r[lVar2] = 0.0;
  }
  r[0xf] = 1.0;
  uVar4 = 0;
  for (lVar2 = 0; (int)lVar2 != 0xc; lVar2 = lVar2 + 4) {
    uVar5 = (ulong)(uVar4 - 1);
    if (uVar4 == 0) {
      uVar5 = 2;
    }
    uVar4 = uVar4 + 1;
    uVar1 = uVar4;
    if (uVar4 == 3) {
      uVar1 = 0;
    }
    r[lVar2 + (ulong)uVar1] = *(float *)((long)&local_40 + uVar5 * 4) * local_30;
    r[(uint)((int)uVar5 + (int)lVar2)] = -*(float *)((long)&local_40 + (ulong)uVar1 * 4) * local_30;
  }
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    fVar7 = *(float *)((long)&local_40 + lVar2 * 4);
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      fVar10 = local_2c;
      if (lVar2 != lVar3) {
        fVar10 = 0.0;
      }
      r[lVar3] = *(float *)((long)&local_40 + lVar3 * 4) * fVar7 * (1.0 - fVar6) + fVar10 + r[lVar3]
      ;
    }
    r = r + 4;
  }
  return;
}

Assistant:

static void
rotate_matrix(float angle, float x, float y, float z, float *r)
{
    float radians, c, s, c1, u[3], length;
    int i, j;

    radians = (float)(angle * M_PI) / 180.0f;

    c = SDL_cosf(radians);
    s = SDL_sinf(radians);

    c1 = 1.0f - SDL_cosf(radians);

    length = (float)SDL_sqrt(x * x + y * y + z * z);

    u[0] = x / length;
    u[1] = y / length;
    u[2] = z / length;

    for (i = 0; i < 16; i++) {
        r[i] = 0.0;
    }

    r[15] = 1.0;

    for (i = 0; i < 3; i++) {
        r[i * 4 + (i + 1) % 3] = u[(i + 2) % 3] * s;
        r[i * 4 + (i + 2) % 3] = -u[(i + 1) % 3] * s;
    }

    for (i = 0; i < 3; i++) {
        for (j = 0; j < 3; j++) {
            r[i * 4 + j] += c1 * u[i] * u[j] + (i == j ? c : 0.0f);
        }
    }
}